

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O2

string * let::format_time(string *__return_storage_ptr__,time_t rawtime,string *format)

{
  tm *__tp;
  allocator local_71;
  time_t rawtime_local;
  char buffer [80];
  
  rawtime_local = rawtime;
  __tp = localtime(&rawtime_local);
  strftime(buffer,0x50,(format->_M_dataplus)._M_p,__tp);
  std::__cxx11::string::string((string *)__return_storage_ptr__,buffer,&local_71);
  return __return_storage_ptr__;
}

Assistant:

std::string format_time(time_t rawtime, const std::string &format)
{
    char buffer[80];
    struct tm *timeinfo = localtime(&rawtime);
    strftime(buffer, sizeof(buffer), format.c_str(), timeinfo);
    return {buffer};
}